

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

bool __thiscall
Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ensure(DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,size_t s)

{
  unsigned_long *puVar1;
  void *placement;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *newArray;
  void *mem;
  size_t newCapacity;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc8;
  unsigned_long local_28;
  unsigned_long local_20;
  ulong local_18 [2];
  bool local_1;
  
  if (in_RDI->_M_string_length < in_RSI) {
    local_28 = in_RDI->_M_string_length << 1;
    local_18[0] = in_RSI;
    puVar1 = std::max<unsigned_long>(local_18,&local_28);
    local_20 = *puVar1;
    placement = Lib::alloc((size_t)in_RDI);
    pbVar2 = array_new<std::__cxx11::string>(placement,in_stack_ffffffffffffffc8);
    if ((in_RDI->field_2)._M_allocated_capacity != 0) {
      array_delete<std::__cxx11::string>(in_RDI,in_stack_ffffffffffffffb8);
      Lib::free((void *)(in_RDI->field_2)._M_allocated_capacity);
    }
    *(ulong *)in_RDI = local_18[0];
    in_RDI->_M_string_length = local_20;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)pbVar2;
    local_1 = false;
  }
  else {
    *(ulong *)in_RDI = in_RSI;
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }